

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)5>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  const_iterator cVar1;
  reference value;
  SchemeFrame *frame_local;
  const_iterator it_local;
  
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::swap
            (&frame->expressions,&frame->resolved_arguments);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::clear
            (&frame->resolved_arguments);
  cVar1 = std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::cbegin(&frame->expressions);
  (frame->exp_it)._M_current = cVar1._M_current;
  value = __gnu_cxx::
          __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
          ::operator*(&frame->exp_it);
  SchemeFrame::setExpression(frame,value);
  return false;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		// Update expressions to call list
		frame.expressions.swap(frame.resolved_arguments);
		frame.resolved_arguments.clear();
		frame.exp_it = frame.expressions.cbegin();
		frame.setExpression(*frame.exp_it);
		// Don't move exp_it
		return false;
	}